

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_graph.c
# Opt level: O1

void glist_sort(_glist *x)

{
  bool bVar1;
  t_gobj *ptVar2;
  int nitems;
  undefined8 in_RDX;
  undefined8 extraout_RDX;
  uint uVar3;
  t_scalar *x_00;
  float fVar4;
  float fVar5;
  t_float x1;
  t_float y1;
  float local_44;
  _glist *local_40;
  t_float local_34;
  
  nitems = (int)in_RDX;
  x_00 = (t_scalar *)x->gl_list;
  if (x_00 == (t_scalar *)0x0) {
    uVar3 = 0;
    bVar1 = true;
  }
  else {
    uVar3 = 0;
    bVar1 = false;
    fVar5 = -1e+37;
    local_40 = x;
    do {
      fVar4 = 0.0;
      if ((x_00->sc_gobj).g_pd == scalar_class) {
        scalar_getbasexy(x_00,&local_44,&local_34);
        in_RDX = extraout_RDX;
        fVar4 = local_44;
      }
      nitems = (int)in_RDX;
      if (fVar4 < fVar5) {
        bVar1 = true;
      }
      uVar3 = uVar3 + 1;
      x_00 = (t_scalar *)(x_00->sc_gobj).g_next;
      fVar5 = fVar4;
    } while (x_00 != (t_scalar *)0x0);
    bVar1 = !bVar1;
    x = local_40;
  }
  if (!bVar1) {
    ptVar2 = glist_dosort((_glist *)x->gl_list,(t_gobj *)(ulong)uVar3,nitems);
    x->gl_list = ptVar2;
  }
  return;
}

Assistant:

void glist_sort(t_glist *x)
{
    int nitems = 0, foo = 0;
    t_float lastx = -1e37;
    t_gobj *g;
    for (g = x->gl_list; g; g = g->g_next)
    {
        t_float x1 = gobj_getxforsort(g);
        if (x1 < lastx)
            foo = 1;
        lastx = x1;
        nitems++;
    }
    if (foo)
        x->gl_list = glist_dosort(x, x->gl_list, nitems);
}